

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O2

void __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::printTo
          (SamplingStrategyResponse *this,ostream *out)

{
  ostream *poVar1;
  string local_40;
  
  std::operator<<(out,"SamplingStrategyResponse(");
  poVar1 = std::operator<<(out,"strategyType=");
  apache::thrift::to_string<jaegertracing::sampling_manager::thrift::SamplingStrategyType::type>
            (&local_40,&this->strategyType);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"probabilisticSampling=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    apache::thrift::
    to_string<jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy>
              (&local_40,&this->probabilisticSampling);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"rateLimitingSampling=");
  if (((byte)this->__isset & 2) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    apache::thrift::to_string<jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy>
              (&local_40,&this->rateLimitingSampling);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"operationSampling=");
  if (((byte)this->__isset & 4) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    apache::thrift::
    to_string<jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies>
              (&local_40,&this->operationSampling);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void SamplingStrategyResponse::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "SamplingStrategyResponse(";
  out << "strategyType=" << to_string(strategyType);
  out << ", " << "probabilisticSampling="; (__isset.probabilisticSampling ? (out << to_string(probabilisticSampling)) : (out << "<null>"));
  out << ", " << "rateLimitingSampling="; (__isset.rateLimitingSampling ? (out << to_string(rateLimitingSampling)) : (out << "<null>"));
  out << ", " << "operationSampling="; (__isset.operationSampling ? (out << to_string(operationSampling)) : (out << "<null>"));
  out << ")";
}